

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

GPU_Target * GPU_CreateAliasTarget(GPU_Target *target)

{
  GPU_Target *pGVar1;
  
  if (_gpu_current_renderer != (GPU_Renderer *)0x0) {
    if (((target != (GPU_Target *)0x0) &&
        (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0)) &&
       (target->context != (GPU_Context *)0x0)) {
      (*_gpu_current_renderer->impl->MakeCurrent)
                (_gpu_current_renderer,target,target->context->windowID);
    }
    if (_gpu_current_renderer->current_context_target != (GPU_Target *)0x0) {
      pGVar1 = (*_gpu_current_renderer->impl->CreateAliasTarget)(_gpu_current_renderer,target);
      return pGVar1;
    }
  }
  return (GPU_Target *)0x0;
}

Assistant:

GPU_Target* GPU_CreateAliasTarget(GPU_Target* target)
{
    if(!CHECK_RENDERER)
        return NULL;
    MAKE_CURRENT_IF_NONE(target);
    if(!CHECK_CONTEXT)
        return NULL;

    return _gpu_current_renderer->impl->CreateAliasTarget(_gpu_current_renderer, target);
}